

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void Service_DeleteNodes(UA_Server *server,UA_Session *session,UA_DeleteNodesRequest *request,
                        UA_DeleteNodesResponse *response)

{
  UA_StatusCode UVar1;
  UA_StatusCode *pUVar2;
  uint local_78;
  uint local_70;
  uint local_6c;
  UA_DeleteNodesItem *item;
  size_t i;
  UA_DeleteNodesResponse *response_local;
  UA_DeleteNodesRequest *request_local;
  UA_Session *session_local;
  UA_Server *server_local;
  
  if (session->channel == (UA_SecureChannel *)0x0) {
    local_70 = 0;
  }
  else {
    if (session->channel->connection == (UA_Connection *)0x0) {
      local_6c = 0;
    }
    else {
      local_6c = session->channel->connection->sockfd;
    }
    local_70 = local_6c;
  }
  if (session->channel == (UA_SecureChannel *)0x0) {
    local_78 = 0;
  }
  else {
    local_78 = (session->channel->securityToken).channelId;
  }
  UA_LOG_DEBUG((server->config).logger,UA_LOGCATEGORY_SESSION,
               "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Processing DeleteNodesRequest"
               ,(ulong)local_70,(ulong)local_78,(ulong)(session->sessionId).identifier.numeric,
               (uint)(session->sessionId).identifier.guid.data2,
               (uint)(session->sessionId).identifier.guid.data3,
               (uint)(session->sessionId).identifier.guid.data4[0],
               (uint)(session->sessionId).identifier.guid.data4[1],
               (uint)(session->sessionId).identifier.guid.data4[2],
               (uint)(session->sessionId).identifier.guid.data4[3],
               (uint)(session->sessionId).identifier.guid.data4[4],
               (uint)(session->sessionId).identifier.guid.data4[5],
               (uint)(session->sessionId).identifier.guid.data4[6],
               (uint)(session->sessionId).identifier.guid.data4[7]);
  if (request->nodesToDeleteSize == 0) {
    (response->responseHeader).serviceResult = 0x800f0000;
  }
  else {
    pUVar2 = (UA_StatusCode *)malloc(request->nodesToDeleteSize << 2);
    response->results = pUVar2;
    if (response->results == (UA_StatusCode *)0x0) {
      (response->responseHeader).serviceResult = 0x80030000;
    }
    else {
      response->resultsSize = request->nodesToDeleteSize;
      for (item = (UA_DeleteNodesItem *)0x0; item < (UA_DeleteNodesItem *)request->nodesToDeleteSize
          ; item = (UA_DeleteNodesItem *)((long)&(item->nodeId).namespaceIndex + 1)) {
        UVar1 = deleteNode(server,session,&request->nodesToDelete[(long)item].nodeId,
                           (UA_Boolean)
                           (request->nodesToDelete[(long)item].deleteTargetReferences & 1));
        response->results[(long)item] = UVar1;
      }
    }
  }
  return;
}

Assistant:

void Service_DeleteNodes(UA_Server *server, UA_Session *session,
                         const UA_DeleteNodesRequest *request,
                         UA_DeleteNodesResponse *response) {
    UA_LOG_DEBUG_SESSION(server->config.logger, session,
                         "Processing DeleteNodesRequest");
    if(request->nodesToDeleteSize == 0) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADNOTHINGTODO;
        return;
    }

    response->results = UA_malloc(sizeof(UA_StatusCode) * request->nodesToDeleteSize);
    if(!response->results) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADOUTOFMEMORY;;
        return;
    }
    response->resultsSize = request->nodesToDeleteSize;

    for(size_t i = 0; i < request->nodesToDeleteSize; ++i) {
        UA_DeleteNodesItem *item = &request->nodesToDelete[i];
        response->results[i] = deleteNode(server, session, &item->nodeId,
                                          item->deleteTargetReferences);
    }
}